

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

int appenddata(char **dst_buf,size_t *dst_len,size_t *dst_alloc,char *src_buf,int src_b64)

{
  CURLcode CVar1;
  size_t sVar2;
  void *pvVar3;
  char *newptr;
  size_t newsize;
  uchar *puStack_50;
  int error;
  anon_union_8_2_5fd17a9a buf64;
  size_t src_len;
  size_t need_alloc;
  uchar *puStack_30;
  int src_b64_local;
  char *src_buf_local;
  size_t *dst_alloc_local;
  size_t *dst_len_local;
  char **dst_buf_local;
  
  need_alloc._4_4_ = src_b64;
  puStack_30 = (uchar *)src_buf;
  src_buf_local = (char *)dst_alloc;
  dst_alloc_local = dst_len;
  dst_len_local = (size_t *)dst_buf;
  buf64 = (anon_union_8_2_5fd17a9a)strlen(src_buf);
  if (buf64.as_uchar == (uchar *)0x0) {
    return 0;
  }
  puStack_50 = (uchar *)0x0;
  if (need_alloc._4_4_ != 0) {
    CVar1 = Curl_base64_decode((char *)puStack_30,&stack0xffffffffffffffb0,(size_t *)&buf64);
    if (CVar1 != CURLE_OK) {
      return -1;
    }
    puStack_30 = puStack_50;
    if ((buf64.as_uchar == (uchar *)0x0) || (puStack_50 == (uchar *)0x0)) {
      if (puStack_50 != (uchar *)0x0) {
        (*Curl_cfree)(puStack_50);
      }
      return -1;
    }
  }
  src_len = (size_t)(buf64.as_uchar + *dst_alloc_local + 1);
  if (*(uchar **)src_buf_local < src_len) {
    sVar2 = src_len * 2;
    pvVar3 = (*Curl_crealloc)((void *)*dst_len_local,sVar2);
    if (pvVar3 == (void *)0x0) {
      if (puStack_50 != (uchar *)0x0) {
        (*Curl_cfree)(puStack_50);
      }
      return -1;
    }
    *(size_t *)src_buf_local = sVar2;
    *dst_len_local = (size_t)pvVar3;
  }
  memcpy((void *)(*dst_len_local + *dst_alloc_local),puStack_30,(size_t)buf64);
  *dst_alloc_local = (size_t)(buf64.as_uchar + *dst_alloc_local);
  *(undefined1 *)(*dst_len_local + *dst_alloc_local) = 0;
  if (puStack_50 != (uchar *)0x0) {
    (*Curl_cfree)(puStack_50);
  }
  return 0;
}

Assistant:

static int appenddata(char  **dst_buf,   /* dest buffer */
                      size_t *dst_len,   /* dest buffer data length */
                      size_t *dst_alloc, /* dest buffer allocated size */
                      char   *src_buf,   /* source buffer */
                      int     src_b64)   /* != 0 if source is base64 encoded */
{
  size_t need_alloc, src_len;
  union {
    unsigned char *as_uchar;
             char *as_char;
  } buf64;

  src_len = strlen(src_buf);
  if(!src_len)
    return GPE_OK;

  buf64.as_char = NULL;

  if(src_b64) {
    /* base64 decode the given buffer */
    int error = (int) Curl_base64_decode(src_buf, &buf64.as_uchar, &src_len);
    if(error)
      return GPE_OUT_OF_MEMORY;
    src_buf = buf64.as_char;
    if(!src_len || !src_buf) {
      /*
      ** currently there is no way to tell apart an OOM condition in
      ** Curl_base64_decode() from zero length decoded data. For now,
      ** let's just assume it is an OOM condition, currently we have
      ** no input for this function that decodes to zero length data.
      */
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
  }

  need_alloc = src_len + *dst_len + 1;

  /* enlarge destination buffer if required */
  if(need_alloc > *dst_alloc) {
    size_t newsize = need_alloc * 2;
    char *newptr = realloc(*dst_buf, newsize);
    if(!newptr) {
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
    *dst_alloc = newsize;
    *dst_buf = newptr;
  }

  /* memcpy to support binary blobs */
  memcpy(*dst_buf + *dst_len, src_buf, src_len);
  *dst_len += src_len;
  *(*dst_buf + *dst_len) = '\0';

  if(buf64.as_char)
    free(buf64.as_char);

  return GPE_OK;
}